

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O2

int nni_taskq_init(nni_taskq **tqp,int nthr)

{
  nni_mtx *mtx;
  undefined8 *puVar1;
  int iVar2;
  nni_taskq *tq;
  nni_taskq_thr *pnVar3;
  ulong uVar4;
  long lVar5;
  int i;
  long lVar6;
  
  tq = (nni_taskq *)nni_zalloc(0xc0);
  iVar2 = 2;
  if (tq != (nni_taskq *)0x0) {
    pnVar3 = (nni_taskq_thr *)nni_zalloc((long)nthr * 0xa0);
    tq->tq_threads = pnVar3;
    if (pnVar3 == (nni_taskq_thr *)0x0) {
      nni_free(tq,0xc0);
    }
    else {
      tq->tq_nthreads = nthr;
      nni_list_init_offset((nni_list *)tq,0);
      mtx = &tq->tq_mtx;
      nni_mtx_init(mtx);
      nni_cv_init(&tq->tq_sched_cv,mtx);
      nni_cv_init(&tq->tq_wait_cv,mtx);
      uVar4 = 0;
      if (0 < nthr) {
        uVar4 = (ulong)(uint)nthr;
      }
      lVar5 = 0;
      do {
        if (uVar4 * 0xa0 + 0xa0 == lVar5 + 0xa0) {
          tq->tq_run = true;
          lVar5 = 8;
          for (lVar6 = 0; lVar6 < tq->tq_nthreads; lVar6 = lVar6 + 1) {
            nni_thr_run((nni_thr *)((long)&tq->tq_threads->tqt_tq + lVar5));
            lVar5 = lVar5 + 0xa0;
          }
          *tqp = tq;
          return 0;
        }
        pnVar3 = tq->tq_threads;
        puVar1 = (undefined8 *)((long)&pnVar3->tqt_tq + lVar5);
        *puVar1 = tq;
        iVar2 = nni_thr_init((nni_thr *)(puVar1 + 1),nni_taskq_thread,
                             (void *)((long)&pnVar3->tqt_tq + lVar5));
        lVar5 = lVar5 + 0xa0;
      } while (iVar2 == 0);
      nni_taskq_fini(tq);
    }
  }
  return iVar2;
}

Assistant:

int
nni_taskq_init(nni_taskq **tqp, int nthr)
{
	nni_taskq *tq;

	if ((tq = NNI_ALLOC_STRUCT(tq)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((tq->tq_threads = NNI_ALLOC_STRUCTS(tq->tq_threads, nthr)) ==
	    NULL) {
		NNI_FREE_STRUCT(tq);
		return (NNG_ENOMEM);
	}
	tq->tq_nthreads = nthr;
	NNI_LIST_INIT(&tq->tq_tasks, nni_task, task_node);

	nni_mtx_init(&tq->tq_mtx);
	nni_cv_init(&tq->tq_sched_cv, &tq->tq_mtx);
	nni_cv_init(&tq->tq_wait_cv, &tq->tq_mtx);

	for (int i = 0; i < nthr; i++) {
		int rv;
		tq->tq_threads[i].tqt_tq = tq;
		rv = nni_thr_init(&tq->tq_threads[i].tqt_thread,
		    nni_taskq_thread, &tq->tq_threads[i]);
		if (rv != 0) {
			nni_taskq_fini(tq);
			return (rv);
		}
	}
	tq->tq_run = true;
	for (int i = 0; i < tq->tq_nthreads; i++) {
		nni_thr_run(&tq->tq_threads[i].tqt_thread);
	}
	*tqp = tq;
	return (0);
}